

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall
MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::VRDatumSpecialized
          (VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>_conflict *this,int inVal)

{
  undefined8 *in_RDI;
  VRCORETYPE_ID_conflict in_stack_0000004c;
  VRDatum_conflict *in_stack_00000050;
  value_type_conflict1 *__x;
  list<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  
  VRDatum::VRDatum(in_stack_00000050,in_stack_0000004c);
  *in_RDI = &PTR__VRDatumSpecialized_001bc970;
  __x = (value_type_conflict1 *)(in_RDI + 9);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x165332);
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 1;
  std::__cxx11::list<int,_std::allocator<int>_>::push_front(in_stack_ffffffffffffffe0,__x);
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }